

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Statement * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,IfStatement *i)

{
  bool bVar1;
  Expression *pEVar2;
  Constant *pCVar3;
  CompileMessage local_78;
  int local_40;
  pool_ptr<soul::AST::Constant> local_30;
  pool_ptr<soul::AST::Constant> constant;
  Statement *result;
  IfStatement *i_local;
  ConstantFolder *this_local;
  
  if ((i->isConstIf & 1U) == 0) {
    constant.object =
         (Constant *)
         ErrorIgnoringRewritingASTVisitor::visit(&this->super_ErrorIgnoringRewritingASTVisitor,i);
    checkAssertion(constant.object == (Constant *)i,"std::addressof (result) == std::addressof (i)",
                   "visit",0x694);
  }
  else {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&i->condition);
  }
  pEVar2 = pool_ref<soul::AST::Expression>::operator->(&i->condition);
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_30);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_30);
  if (bVar1) {
    pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_30);
    bVar1 = soul::Value::getAsBool(&pCVar3->value);
    if (bVar1) {
      RewritingASTVisitor::replaceStatement((RewritingASTVisitor *)this,&i->trueBranch);
      this_local = (ConstantFolder *)
                   pool_ref::operator_cast_to_Statement_((pool_ref *)&i->trueBranch);
      local_40 = 1;
    }
    else {
      bVar1 = pool_ptr<soul::AST::Statement>::operator!=(&i->falseBranch,(void *)0x0);
      if (bVar1) {
        RewritingASTVisitor::replaceStatement((RewritingASTVisitor *)this,&i->falseBranch);
        this_local = (ConstantFolder *)pool_ptr<soul::AST::Statement>::operator*(&i->falseBranch);
        local_40 = 1;
      }
      else {
        this_local = (ConstantFolder *)
                     AST::Allocator::allocate<soul::AST::NoopStatement,soul::AST::Context&>
                               ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                                &(i->super_Statement).super_ASTObject.context);
        local_40 = 1;
      }
    }
  }
  else {
    local_40 = 0;
  }
  pool_ptr<soul::AST::Constant>::~pool_ptr(&local_30);
  if ((local_40 == 0) && (this_local = (ConstantFolder *)i, (i->isConstIf & 1U) != 0)) {
    if (((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors & 1U) == 0) {
      pEVar2 = pool_ref<soul::AST::Expression>::operator->(&i->condition);
      Errors::expectedConstant<>();
      AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_78,false);
    }
    (this->super_ErrorIgnoringRewritingASTVisitor).numFails =
         (this->super_ErrorIgnoringRewritingASTVisitor).numFails + 1;
  }
  return (Statement *)this_local;
}

Assistant:

AST::Statement& visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
            {
                replaceExpression (i.condition);
            }
            else
            {
                auto& result = super::visit (i);
                SOUL_ASSERT (std::addressof (result) == std::addressof (i));
            }

            if (auto constant = i.condition->getAsConstant())
            {
                if (constant->value.getAsBool())
                {
                    replaceStatement (i.trueBranch);
                    return i.trueBranch;
                }

                if (i.falseBranch != nullptr)
                {
                    replaceStatement (i.falseBranch);
                    return *i.falseBranch;
                }

                return allocator.allocate<AST::NoopStatement> (i.context);
            }

            if (i.isConstIf)
            {
                if (! ignoreErrors)
                    i.condition->context.throwError (Errors::expectedConstant());
                else
                    ++numFails;
            }

            return i;
        }